

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

int Cec_GiaSplitTest(Gia_Man_t *p,int nProcs,int nTimeOut,int nIterMax,int LookAhead,int fVerbose,
                    int fVeryVerbose,int fSilent)

{
  bool bVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *p_00;
  bool bVar4;
  int local_50;
  int RetValue;
  int fOneUndef;
  int RetValue1;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pOne;
  Abc_Cex_t *pCex;
  int fVerbose_local;
  int LookAhead_local;
  int nIterMax_local;
  int nTimeOut_local;
  int nProcs_local;
  Gia_Man_t *p_local;
  
  pOne = (Gia_Man_t *)0x0;
  bVar1 = false;
  local_50 = -1;
  Abc_CexFreeP(&p->pCexComb);
  fOneUndef = 0;
  while( true ) {
    iVar2 = Gia_ManPoNum(p);
    bVar4 = false;
    if (fOneUndef < iVar2) {
      pGVar3 = Gia_ManCo(p,fOneUndef);
      bVar4 = pGVar3 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    p_00 = Gia_ManDupOutputGroup(p,fOneUndef,fOneUndef + 1);
    if (fVerbose != 0) {
      printf("\nSolving output %d:\n",(ulong)(uint)fOneUndef);
    }
    iVar2 = Cec_GiaSplitTestInt(p_00,nProcs,nTimeOut,nIterMax,LookAhead,fVerbose,fVeryVerbose,
                                fSilent);
    Gia_ManStop(p_00);
    if ((iVar2 == 0) && (local_50 == -1)) {
      pOne = (Gia_Man_t *)p_00->pCexComb;
      p_00->pCexComb = (Abc_Cex_t *)0x0;
      *(int *)&pOne->pName = fOneUndef;
      local_50 = 0;
    }
    if (iVar2 == -1) {
      bVar1 = true;
    }
    fOneUndef = fOneUndef + 1;
  }
  if (local_50 == -1) {
    local_50 = 1;
    if (bVar1) {
      local_50 = -1;
    }
  }
  else {
    p->pCexComb = (Abc_Cex_t *)pOne;
  }
  return local_50;
}

Assistant:

int Cec_GiaSplitTest( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent )
{
    Abc_Cex_t * pCex = NULL;
    Gia_Man_t * pOne;
    Gia_Obj_t * pObj;
    int i, RetValue1, fOneUndef = 0, RetValue = -1;
    Abc_CexFreeP( &p->pCexComb );
    Gia_ManForEachPo( p, pObj, i )
    {
        pOne = Gia_ManDupOutputGroup( p, i, i+1 );
        if ( fVerbose )
            printf( "\nSolving output %d:\n", i );
        RetValue1 = Cec_GiaSplitTestInt( pOne, nProcs, nTimeOut, nIterMax, LookAhead,  fVerbose, fVeryVerbose, fSilent );
        Gia_ManStop( pOne );
        // collect the result
        if ( RetValue1 == 0 && RetValue == -1 )
        {
            pCex = pOne->pCexComb; pOne->pCexComb = NULL;
            pCex->iPo = i;
            RetValue = 0;
        }
        if ( RetValue1 == -1 )
            fOneUndef = 1;
    }
    if ( RetValue == -1 )
        RetValue = fOneUndef ? -1 : 1;
    else
        p->pCexComb = pCex;
    return RetValue;
}